

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall cfd::core::Psbt::Psbt(Psbt *this,Psbt *psbt)

{
  ByteData local_30;
  Psbt *local_18;
  Psbt *psbt_local;
  Psbt *this_local;
  
  local_18 = psbt;
  psbt_local = this;
  GetData(&local_30,psbt);
  Psbt(this,&local_30);
  ByteData::~ByteData(&local_30);
  return;
}

Assistant:

Psbt::Psbt(const Psbt &psbt) : Psbt(psbt.GetData()) {
  // copy constructor
}